

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# front_stablizer.h
# Opt level: O0

void __thiscall FrontStablizer::FrontStablizer(FrontStablizer *this,size_t numchans)

{
  FlexArray<std::array<float,_256UL>,_16UL> *in_RSI;
  void *in_RDI;
  
  memset(in_RDI,0,0x1400);
  memset((void *)((long)in_RDI + 0x1400),0,0x1400);
  memset((void *)((long)in_RDI + 0x2800),0,0x400);
  memset((void *)((long)in_RDI + 0x2c00),0,0x1400);
  BandSplitterR<float>::BandSplitterR((BandSplitterR<float> *)((long)in_RDI + 0x4000));
  memset((void *)((long)in_RDI + 0x4010),0,0x1000);
  memset((void *)((long)in_RDI + 0x5010),0,0x1000);
  al::FlexArray<std::array<float,_256UL>,_16UL>::FlexArray(in_RSI,(index_type)in_RDI);
  return;
}

Assistant:

FrontStablizer(size_t numchans) : DelayBuf{numchans} { }